

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int verify_miniscript_andor(miniscript_node_t *node,miniscript_node_t *parent)

{
  int32_t iVar1;
  uint32_t uVar2;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  iVar1 = get_child_list_count(node);
  if (iVar1 == node->info->inner_num) {
    uVar2 = verify_miniscript_andor_property
                      (node->child->type_properties,node->child->next->type_properties,
                       node->child->next->next->type_properties);
    node->type_properties = uVar2;
    if (node->type_properties == 0) {
      node_local._4_4_ = -2;
    }
    else {
      node_local._4_4_ = 0;
    }
  }
  else {
    node_local._4_4_ = -2;
  }
  return node_local._4_4_;
}

Assistant:

static int verify_miniscript_andor(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    (void)parent;
    if (get_child_list_count(node) != node->info->inner_num)
        return WALLY_EINVAL;

    node->type_properties = verify_miniscript_andor_property(
        node->child->type_properties,
        node->child->next->type_properties,
        node->child->next->next->type_properties);
    if (!node->type_properties)
        return WALLY_EINVAL;

    return WALLY_OK;
}